

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  byte bVar1;
  byte bVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  pointer pbVar5;
  pointer pbVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  code *pcVar11;
  iterator iVar12;
  mapped_type *pmVar13;
  long lVar14;
  undefined8 uVar15;
  mapped_type mVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  anon_struct_12_3_a9df7b98 *paVar17;
  ulong uVar18;
  ulong uVar19;
  byte *pbVar20;
  byte *pbVar21;
  pointer pbVar22;
  string namebuf;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  string linebuf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  index_t idx;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  stringstream errss;
  key_type local_4a8;
  allocator local_481;
  string *local_480;
  pointer local_478;
  pointer local_470;
  ios_base *local_468;
  string *local_460;
  anon_struct_12_3_a9df7b98 *local_458;
  iterator iStack_450;
  anon_struct_12_3_a9df7b98 *local_448;
  string local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8;
  MaterialReader *local_3e0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_3d8;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> local_3b8;
  pointer local_398;
  undefined1 local_390 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380 [7];
  ios_base local_310 [264];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1e8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_480 = warn;
  local_460 = err;
  local_3e0 = readMatFn;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_448 = (anon_struct_12_3_a9df7b98 *)0x0;
  local_458 = (anon_struct_12_3_a9df7b98 *)0x0;
  iStack_450._M_current = (anon_struct_12_3_a9df7b98 *)0x0;
  local_3b8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_418,2);
  local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  local_438._M_string_length = 0;
  local_438.field_2._M_local_buf[0] = '\0';
  local_468 = local_310;
LAB_0010f7de:
  do {
    iVar7 = std::istream::peek();
    if (iVar7 == -1) {
      if (local_460 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)local_460,local_390._0_8_);
        if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
          operator_delete((void *)local_390._0_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p);
      }
      if ((anon_struct_12_3_a9df7b98 *)
          local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (anon_struct_12_3_a9df7b98 *)0x0) {
        operator_delete(local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_418);
      std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&local_3b8);
      if (local_458 != (anon_struct_12_3_a9df7b98 *)0x0) {
        operator_delete(local_458);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_1e8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return true;
    }
    safeGetline(inStream,&local_438);
    _Var4._M_p = local_438._M_dataplus._M_p;
  } while (local_438._M_string_length == 0);
  if (local_438._M_dataplus._M_p[local_438._M_string_length - 1] == '\n') goto code_r0x0010f816;
  goto LAB_0010f832;
code_r0x0010f816:
  local_438._M_string_length = local_438._M_string_length - 1;
  local_438._M_dataplus._M_p[local_438._M_string_length] = '\0';
  if (local_438._M_string_length == 0) goto LAB_0010f7de;
LAB_0010f832:
  if (local_438._M_dataplus._M_p[local_438._M_string_length - 1] == '\r') {
    local_438._M_string_length = local_438._M_string_length - 1;
    local_438._M_dataplus._M_p[local_438._M_string_length] = '\0';
    if (local_438._M_string_length == 0) goto LAB_0010f7de;
    sVar10 = strspn(local_438._M_dataplus._M_p," \t");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      __assert_fail("token",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/tiny_obj_loader.h"
                    ,0xa55,
                    "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                   );
    }
  }
  else {
    sVar10 = strspn(local_438._M_dataplus._M_p," \t");
  }
  pbVar20 = (byte *)(_Var4._M_p + sVar10);
  bVar1 = *pbVar20;
  if (bVar1 < 0x66) {
    if ((bVar1 == 0) || (bVar1 == 0x23)) goto LAB_0010f7de;
  }
  else if (bVar1 == 0x66) {
    if ((pbVar20[1] == 0x20) || (pbVar20[1] == 9)) {
      sVar10 = strspn((char *)(pbVar20 + 2)," \t");
      if (iStack_450._M_current != local_458) {
        iStack_450._M_current = local_458;
      }
      pbVar20 = pbVar20 + sVar10 + 2;
      while ((0xd < *pbVar20 || ((0x2401U >> (*pbVar20 & 0x1f) & 1) == 0))) {
        iVar8 = atoi((char *)pbVar20);
        sVar10 = strcspn((char *)pbVar20,"/ \t\r");
        pbVar21 = pbVar20 + sVar10;
        iVar7 = 0;
        if (pbVar20[sVar10] == 0x2f) {
          if (pbVar21[1] == 0x2f) {
            pbVar21 = pbVar21 + 2;
            iVar9 = 0;
          }
          else {
            pbVar20 = pbVar21 + 1;
            iVar9 = atoi((char *)pbVar20);
            sVar10 = strcspn((char *)pbVar20,"/ \t\r");
            pbVar21 = pbVar20 + sVar10;
            if (pbVar20[sVar10] != 0x2f) goto LAB_0010fb4c;
            pbVar21 = pbVar21 + 1;
          }
          iVar7 = atoi((char *)pbVar21);
          sVar10 = strcspn((char *)pbVar21,"/ \t\r");
          pbVar21 = pbVar21 + sVar10;
        }
        else {
          iVar9 = 0;
          iVar7 = 0;
        }
LAB_0010fb4c:
        local_390._4_4_ = iVar7;
        local_390._0_4_ = iVar8;
        local_390._8_4_ = iVar9;
        if (iStack_450._M_current == local_448) {
          std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
          _M_realloc_insert<tinyobj::index_t_const&>
                    ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&local_458,
                     iStack_450,(anon_struct_12_3_a9df7b98 *)local_390);
        }
        else {
          (iStack_450._M_current)->texcoord_index = iVar9;
          (iStack_450._M_current)->vertex_index = iVar8;
          (iStack_450._M_current)->normal_index = iVar7;
          iStack_450._M_current = iStack_450._M_current + 1;
        }
        sVar10 = strspn((char *)pbVar21," \t\r");
        pbVar20 = pbVar21 + sVar10;
      }
      pcVar11 = *(code **)(callback + 0x18);
      if ((pcVar11 == (code *)0x0) || ((long)iStack_450._M_current - (long)local_458 == 0))
      goto LAB_0010f7de;
      uVar18 = ((long)iStack_450._M_current - (long)local_458 >> 2) * -0x5555555555555555;
      paVar17 = local_458;
      goto LAB_0010fbf6;
    }
  }
  else if (bVar1 == 0x76) {
    bVar2 = pbVar20[1];
    if (bVar2 < 0x6e) {
      if ((bVar2 == 9) || (bVar2 == 0x20)) {
        sVar10 = strspn((char *)(pbVar20 + 2)," \t");
        pbVar20 = pbVar20 + sVar10 + 2;
        sVar10 = strcspn((char *)pbVar20," \t\r");
        pbVar21 = pbVar20 + sVar10;
        local_390._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar20,(char *)pbVar21,(double *)local_390);
        local_470 = (pointer)local_390._0_8_;
        sVar10 = strspn((char *)pbVar21," \t");
        pbVar21 = pbVar21 + sVar10;
        sVar10 = strcspn((char *)pbVar21," \t\r");
        pbVar20 = pbVar21 + sVar10;
        local_390._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar21,(char *)pbVar20,(double *)local_390);
        local_478 = (pointer)local_390._0_8_;
        sVar10 = strspn((char *)pbVar20," \t");
        pbVar20 = pbVar20 + sVar10;
        sVar10 = strcspn((char *)pbVar20," \t\r");
        pbVar21 = pbVar20 + sVar10;
        local_390._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar20,(char *)pbVar21,(double *)local_390);
        local_398 = (pointer)local_390._0_8_;
        sVar10 = strspn((char *)pbVar21," \t");
        pbVar21 = pbVar21 + sVar10;
        sVar10 = strcspn((char *)pbVar21," \t\r");
        local_390._0_8_ = (pointer)0x3ff0000000000000;
        tryParseDouble((char *)pbVar21,(char *)(pbVar21 + sVar10),(double *)local_390);
        if (*(code **)callback != (code *)0x0) {
          (**(code **)callback)
                    ((float)(double)local_470,(float)(double)local_478,(float)(double)local_398,
                     (float)(double)local_390._0_8_,user_data);
        }
        goto LAB_0010f7de;
      }
    }
    else if (bVar2 == 0x6e) {
      if ((pbVar20[2] == 0x20) || (pbVar20[2] == 9)) {
        sVar10 = strspn((char *)(pbVar20 + 3)," \t");
        pbVar20 = pbVar20 + sVar10 + 3;
        sVar10 = strcspn((char *)pbVar20," \t\r");
        pbVar21 = pbVar20 + sVar10;
        local_390._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar20,(char *)pbVar21,(double *)local_390);
        local_470 = (pointer)local_390._0_8_;
        sVar10 = strspn((char *)pbVar21," \t");
        pbVar21 = pbVar21 + sVar10;
        sVar10 = strcspn((char *)pbVar21," \t\r");
        pbVar20 = pbVar21 + sVar10;
        local_390._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar21,(char *)pbVar20,(double *)local_390);
        local_478 = (pointer)local_390._0_8_;
        sVar10 = strspn((char *)pbVar20," \t");
        pbVar20 = pbVar20 + sVar10;
        sVar10 = strcspn((char *)pbVar20," \t\r");
        local_390._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar20,(char *)(pbVar20 + sVar10),(double *)local_390);
        if (*(code **)(callback + 8) != (code *)0x0) {
          (**(code **)(callback + 8))
                    ((float)(double)local_470,(float)(double)local_478,
                     (float)(double)local_390._0_8_,user_data);
        }
        goto LAB_0010f7de;
      }
    }
    else if ((bVar2 == 0x74) && ((pbVar20[2] == 0x20 || (pbVar20[2] == 9)))) {
      sVar10 = strspn((char *)(pbVar20 + 3)," \t");
      pbVar20 = pbVar20 + sVar10 + 3;
      sVar10 = strcspn((char *)pbVar20," \t\r");
      pbVar21 = pbVar20 + sVar10;
      local_390._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar20,(char *)pbVar21,(double *)local_390);
      local_470 = (pointer)local_390._0_8_;
      sVar10 = strspn((char *)pbVar21," \t");
      pbVar21 = pbVar21 + sVar10;
      sVar10 = strcspn((char *)pbVar21," \t\r");
      pbVar20 = pbVar21 + sVar10;
      local_390._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar21,(char *)pbVar20,(double *)local_390);
      local_478 = (pointer)local_390._0_8_;
      sVar10 = strspn((char *)pbVar20," \t");
      pbVar20 = pbVar20 + sVar10;
      sVar10 = strcspn((char *)pbVar20," \t\r");
      local_390._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar20,(char *)(pbVar20 + sVar10),(double *)local_390);
      if (*(code **)(callback + 0x10) != (code *)0x0) {
        (**(code **)(callback + 0x10))
                  ((float)(double)local_470,(float)(double)local_478,(float)(double)local_390._0_8_,
                   user_data);
      }
      goto LAB_0010f7de;
    }
  }
  iVar7 = strncmp((char *)pbVar20,"usemtl",6);
  if ((iVar7 == 0) && ((pbVar20[6] == 0x20 || (pbVar20[6] == 9)))) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_390);
    sVar10 = strlen((char *)(pbVar20 + 7));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_390 + 0x10),(char *)(pbVar20 + 7),sVar10);
    std::__cxx11::stringbuf::str();
    iVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&local_1e8,&local_4a8);
    if ((_Rb_tree_header *)iVar12._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
      mVar16 = -1;
    }
    else {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)&local_1e8,&local_4a8);
      mVar16 = *pmVar13;
    }
    if (*(code **)(callback + 0x20) != (code *)0x0) {
      (**(code **)(callback + 0x20))(user_data,local_4a8._M_dataplus._M_p,mVar16);
    }
  }
  else {
    iVar7 = strncmp((char *)pbVar20,"mtllib",6);
    pbVar6 = local_418.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = local_418.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((iVar7 == 0) && ((pbVar20[6] == 0x20 || (pbVar20[6] == 9)))) {
      if (local_3e0 != (MaterialReader *)0x0) {
        local_3f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string
                  ((string *)local_390,(char *)(pbVar20 + 7),(allocator *)&local_4a8);
        SplitString((string *)local_390,(char)&local_3f8,elems);
        if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
          operator_delete((void *)local_390._0_8_);
        }
        if (local_3f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_3f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (local_480 != (string *)0x0) {
            std::__cxx11::string::append((char *)local_480);
          }
        }
        else {
          lVar14 = 0;
          uVar18 = 0;
          do {
            local_390._0_8_ = local_390 + 0x10;
            local_390._8_8_ = 0;
            local_380[0]._M_local_buf[0] = '\0';
            local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
            local_4a8._M_string_length = 0;
            local_4a8.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::string
                      ((string *)local_208,
                       *(char **)((long)&((local_3f8.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar14),&local_481);
            iVar7 = (*local_3e0->_vptr_MaterialReader[2])
                              (local_3e0,(string *)local_208,&local_3b8,&local_1e8,local_390,
                               &local_4a8);
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0]);
            }
            if ((local_480 != (string *)0x0) && (local_390._8_8_ != 0)) {
              std::__cxx11::string::_M_append((char *)local_480,local_390._0_8_);
            }
            if ((local_460 != (string *)0x0) && (local_4a8._M_string_length != 0)) {
              std::__cxx11::string::_M_append((char *)local_460,(ulong)local_4a8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
              operator_delete(local_4a8._M_dataplus._M_p);
            }
            if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
              operator_delete((void *)local_390._0_8_);
            }
            if ((char)iVar7 != '\0') {
              if (*(code **)(callback + 0x28) == (code *)0x0) goto LAB_00110445;
              if (local_3b8.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_3b8.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_start) goto LAB_001105a7;
              (**(code **)(callback + 0x28))
                        (user_data,
                         local_3b8.
                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)local_3b8.
                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_3b8.
                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x63fb9aeb1fdcd759
                        );
              goto LAB_00110445;
            }
            uVar18 = uVar18 + 1;
            lVar14 = lVar14 + 0x20;
          } while (uVar18 < (ulong)((long)local_3f8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_3f8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
          if (local_480 != (string *)0x0) {
            std::__cxx11::string::append((char *)local_480);
          }
        }
LAB_00110445:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3f8);
      }
      goto LAB_0010f7de;
    }
    if (bVar1 != 0x6f) {
      if ((bVar1 != 0x67) || ((pbVar20[1] != 0x20 && (pbVar20[1] != 9)))) goto LAB_0010f7de;
      pbVar22 = local_418.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_418.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_418.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          pcVar3 = (pbVar22->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &pbVar22->field_2) {
            operator_delete(pcVar3);
          }
          pbVar22 = pbVar22 + 1;
        } while (pbVar22 != pbVar6);
        local_418.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
      }
      while( true ) {
        if ((*pbVar20 < 0xe) && ((0x2401U >> (*pbVar20 & 0x1f) & 1) != 0)) break;
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        local_4a8._M_string_length = 0;
        local_4a8.field_2._M_local_buf[0] = '\0';
        sVar10 = strspn((char *)pbVar20," \t");
        pbVar20 = pbVar20 + sVar10;
        sVar10 = strcspn((char *)pbVar20," \t\r");
        pbVar21 = pbVar20 + sVar10;
        local_390._0_8_ = local_390 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_390,pbVar20,pbVar21);
        std::__cxx11::string::operator=((string *)&local_4a8,(string *)local_390);
        if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
          operator_delete((void *)local_390._0_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_418,&local_4a8);
        sVar10 = strspn((char *)pbVar21," \t\r");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p);
        }
        pbVar20 = pbVar21 + sVar10;
      }
      if ((long)local_418.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_418.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
        __assert_fail("names.size() > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/tiny_obj_loader.h"
                      ,0xaf0,
                      "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                     );
      }
      if (*(code **)(callback + 0x30) == (code *)0x0) goto LAB_0010f7de;
      uVar18 = (long)local_418.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_418.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar18 < 2) {
        (**(code **)(callback + 0x30))(user_data,0,0);
        goto LAB_0010f7de;
      }
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&local_3d8,uVar18 - 1);
      if (local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar18 = 0;
      }
      else {
        lVar14 = 0x20;
        uVar19 = 0;
        do {
          *(undefined8 *)
           ((int *)local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_start + uVar19 * 2) =
               *(undefined8 *)
                ((long)&((local_418.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar14);
          uVar19 = uVar19 + 1;
          uVar18 = (long)local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3;
          lVar14 = lVar14 + 0x20;
        } while (uVar19 < uVar18);
      }
      if (local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                   uVar18);
LAB_001105a7:
        uVar15 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        if ((anon_struct_12_3_a9df7b98 *)
            local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start != (anon_struct_12_3_a9df7b98 *)0x0) {
          operator_delete(local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_418);
        std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&local_3b8);
        if (local_458 != (anon_struct_12_3_a9df7b98 *)0x0) {
          operator_delete(local_458);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree(&local_1e8);
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar15);
      }
      pcVar11 = *(code **)(callback + 0x30);
      paVar17 = (anon_struct_12_3_a9df7b98 *)
                local_3d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_0010fbf6:
      (*pcVar11)(user_data,paVar17,uVar18);
      goto LAB_0010f7de;
    }
    if ((pbVar20[1] != 0x20) && (pbVar20[1] != 9)) goto LAB_0010f7de;
    std::__cxx11::stringstream::stringstream((stringstream *)local_390);
    sVar10 = strlen((char *)(pbVar20 + 2));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_390 + 0x10),(char *)(pbVar20 + 2),sVar10);
    std::__cxx11::stringbuf::str();
    if (*(code **)(callback + 0x38) != (code *)0x0) {
      (**(code **)(callback + 0x38))(user_data,local_4a8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_390);
  std::ios_base::~ios_base(local_468);
  goto LAB_0010f7de;
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      if (material_map.find(namebuf) != material_map.end()) {
        newMaterialId = material_map[namebuf];
      } else {
        // { error!! material not found }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}